

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

void __thiscall gl4cts::DirectStateAccess::Textures::CopyErrorsTest::Prepare(CopyErrorsTest *this)

{
  code *pcVar1;
  char cVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined4 *puVar6;
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar5 + 0x6d0))(1,&this->m_fbo);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glGenFramebuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2a2a);
  (**(code **)(lVar5 + 0x78))(0x8d40,this->m_fbo);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2a2d);
  (**(code **)(lVar5 + 0x400))(0xde1,1,&this->m_to_src);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glCreateTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2a30);
  (**(code **)(lVar5 + 0x1450))(this->m_to_src,1,0x8058,4,4);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glTextureStorage2D has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2a33);
  (**(code **)(lVar5 + 0x6a0))(0x8d40,0x8ce0,0xde1,this->m_to_src,0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glFramebufferTexture1D call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2a36);
  iVar3 = (**(code **)(lVar5 + 0x170))(0x8d40);
  if (iVar3 == 0x8cd5) {
    (**(code **)(lVar5 + 0x1a00))(0,0,4,4);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glViewport call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x2a3e);
    (**(code **)(lVar5 + 0x188))(0x4000);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glClear call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x2a41);
    (**(code **)(lVar5 + 0x6d0))(1,&this->m_fbo_ms);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glGenFramebuffers call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x2a45);
    (**(code **)(lVar5 + 0x78))(0x8d40,this->m_fbo_ms);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glBindFramebuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x2a48);
    (**(code **)(lVar5 + 0x400))(0x9100,1,&this->m_to_src_ms);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glCreateTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x2a4b);
    (**(code **)(lVar5 + 0x1460))(this->m_to_src_ms,1,0x8058,4,4,0);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glTextureStorage2DMultisample has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x2a4e);
    (**(code **)(lVar5 + 0x6a0))(0x8d40,0x8ce0,0x9100,this->m_to_src_ms,0);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glFramebufferTexture1D call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x2a51);
    iVar3 = (**(code **)(lVar5 + 0x170))(0x8d40);
    if (iVar3 == 0x8cd5) {
      (**(code **)(lVar5 + 0x1a00))(0,0,4,4);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glViewport call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x2a59);
      (**(code **)(lVar5 + 0x188))(0x4000);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glClear call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x2a5c);
      (**(code **)(lVar5 + 0x3c0))(1,&this->m_fbo_incomplete);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glcreateFramebuffers call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x2a60);
      (**(code **)(lVar5 + 0x400))(0xde0,1,&this->m_to_1D_dst);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glCreateTextures has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x2a64);
      (**(code **)(lVar5 + 0x1440))(this->m_to_1D_dst,1,0x8058,4);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glTextureStorage2D has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x2a67);
      (**(code **)(lVar5 + 0x400))(0xde1,1,&this->m_to_2D_dst);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glCreateTextures has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x2a6b);
      (**(code **)(lVar5 + 0x1450))(this->m_to_2D_dst,1,0x8058,4,4);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glTextureStorage2D has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x2a6e);
      (**(code **)(lVar5 + 0x400))(0x806f,1,&this->m_to_3D_dst);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glCreateTextures has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x2a72);
      (**(code **)(lVar5 + 0x1468))(this->m_to_3D_dst,1,0x8058,4,4,4);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glTextureStorage2D has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x2a75);
      do {
        pcVar1 = *(code **)(lVar5 + 0xcc8);
        this->m_to_invalid = this->m_to_invalid + 1;
        cVar2 = (*pcVar1)();
      } while (cVar2 != '\0');
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glIsTexture has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x2a7a);
      return;
    }
  }
  puVar6 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar6 = 0;
  __cxa_throw(puVar6,&int::typeinfo,0);
}

Assistant:

void CopyErrorsTest::Prepare()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Auxiliary objects setup. */

	/* Framebuffer. */
	gl.genFramebuffers(1, &m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	gl.createTextures(GL_TEXTURE_2D, 1, &m_to_src);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	gl.textureStorage2D(m_to_src, 1, s_internalformat, s_width, s_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureStorage2D has failed");

	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_to_src, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture1D call failed.");

	if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
	{
		throw 0;
	}

	gl.viewport(0, 0, s_width, s_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport call failed.");

	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClear call failed.");

	/* Framebuffer Multisample. */
	gl.genFramebuffers(1, &m_fbo_ms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_ms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	gl.createTextures(GL_TEXTURE_2D_MULTISAMPLE, 1, &m_to_src_ms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	gl.textureStorage2DMultisample(m_to_src_ms, 1, s_internalformat, s_width, s_height, false);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureStorage2DMultisample has failed");

	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, m_to_src_ms, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture1D call failed.");

	if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
	{
		throw 0;
	}

	gl.viewport(0, 0, s_width, s_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport call failed.");

	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClear call failed.");

	/* Framebuffer Incomplete. */
	gl.createFramebuffers(1, &m_fbo_incomplete);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glcreateFramebuffers call failed.");

	/* 1D */
	gl.createTextures(GL_TEXTURE_1D, 1, &m_to_1D_dst);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	gl.textureStorage1D(m_to_1D_dst, 1, s_internalformat, s_width);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureStorage2D has failed");

	/* 2D */
	gl.createTextures(GL_TEXTURE_2D, 1, &m_to_2D_dst);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	gl.textureStorage2D(m_to_2D_dst, 1, s_internalformat, s_width, s_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureStorage2D has failed");

	/* 3D */
	gl.createTextures(GL_TEXTURE_3D, 1, &m_to_3D_dst);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	gl.textureStorage3D(m_to_3D_dst, 1, s_internalformat, s_width, s_height, s_depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureStorage2D has failed");

	/* invalid texture object */
	while (gl.isTexture(++m_to_invalid))
		;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glIsTexture has failed");
}